

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O1

SampledSpectrum __thiscall
pbrt::RGBIlluminantSpectrum::Sample(RGBIlluminantSpectrum *this,SampledWavelengths *lambda)

{
  float fVar1;
  undefined8 uVar2;
  array<float,_4> aVar3;
  int i;
  long lVar4;
  float fVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [56];
  undefined1 auVar8 [64];
  undefined1 auVar10 [56];
  undefined1 auVar9 [64];
  undefined1 auVar11 [16];
  SampledSpectrum SVar12;
  SampledSpectrum s;
  float local_28 [4];
  
  local_28[0] = 0.0;
  local_28[1] = 0.0;
  local_28[2] = 0.0;
  local_28[3] = 0.0;
  lVar4 = 0;
  auVar8 = ZEXT1664(ZEXT816(0) << 0x40);
  do {
    fVar1 = this->scale;
    auVar6 = ZEXT416((uint)(lambda->lambda).values[lVar4]);
    auVar11 = vfmadd213ss_fma(ZEXT416((uint)(this->rsp).c0),auVar6,ZEXT416((uint)(this->rsp).c1));
    auVar11 = vfmadd213ss_fma(auVar11,auVar6,ZEXT416((uint)(this->rsp).c2));
    if ((auVar11._0_4_ & 0x7fffffff) == 0x7f800000) {
      uVar2 = vcmpss_avx512f(auVar8._0_16_,auVar11,1);
      fVar5 = (float)((uint)((byte)uVar2 & 1) * 0x3f800000);
    }
    else {
      auVar6 = vfmadd213ss_fma(auVar11,auVar11,SUB6416(ZEXT464(0x3f800000),0));
      if (auVar6._0_4_ < 0.0) {
        fVar5 = sqrtf(auVar6._0_4_);
        auVar11 = ZEXT416(auVar11._0_4_);
        auVar8 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
        auVar6 = vsqrtss_avx(auVar6,auVar6);
        fVar5 = auVar6._0_4_;
      }
      fVar5 = auVar11._0_4_ / (fVar5 + fVar5) + 0.5;
    }
    auVar10 = auVar8._8_56_;
    auVar7 = (undefined1  [56])0x0;
    local_28[lVar4] = fVar1 * fVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  SVar12 = DenselySampledSpectrum::Sample(this->illuminant,lambda);
  auVar9._0_8_ = SVar12.values.values._8_8_;
  auVar9._8_56_ = auVar10;
  auVar8._0_8_ = SVar12.values.values._0_8_;
  auVar8._8_56_ = auVar7;
  auVar11 = vmovlhps_avx(auVar8._0_16_,auVar9._0_16_);
  aVar3.values[1] = auVar11._4_4_ * local_28[1];
  aVar3.values[0] = auVar11._0_4_ * local_28[0];
  aVar3.values[2] = auVar11._8_4_ * local_28[2];
  aVar3.values[3] = auVar11._12_4_ * local_28[3];
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

Sample(const SampledWavelengths &lambda) const {
        SampledSpectrum s;
        for (int i = 0; i < NSpectrumSamples; ++i)
            s[i] = scale * rsp(lambda[i]);
        return s * illuminant->Sample(lambda);
    }